

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O0

void __thiscall wasm::ThreadPool::initialize(ThreadPool *this,size_t num)

{
  size_type sVar1;
  system_error *anon_var_0;
  unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_> local_68;
  ulong local_60;
  size_t i;
  undefined1 local_48 [8];
  unique_lock<std::mutex> lock;
  size_t num_local;
  ThreadPool *this_local;
  memory_order __b;
  
  if (num != 1) {
    lock._8_8_ = num;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_48,(mutex_type *)threadMutex);
    sVar1 = std::
            vector<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
            ::size(&this->threads);
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    LOCK();
    (this->ready).super___atomic_base<unsigned_long>._M_i = sVar1;
    UNLOCK();
    resetThreadsAreReady(this);
    for (local_60 = 0; local_60 < (ulong)lock._8_8_; local_60 = local_60 + 1) {
      std::make_unique<wasm::Thread,wasm::ThreadPool*>((ThreadPool **)&local_68);
      std::
      vector<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>,std::allocator<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>>>
      ::emplace_back<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>>
                ((vector<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>,std::allocator<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>>>
                  *)this,&local_68);
      std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>::~unique_ptr(&local_68);
    }
    std::condition_variable::wait<wasm::ThreadPool::initialize(unsigned_long)::__0>
              (&this->condition,(unique_lock<std::mutex> *)local_48,(anon_class_8_1_8991fb9c)this);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  }
  return;
}

Assistant:

void ThreadPool::initialize(size_t num) {
  if (num == 1) {
    return; // no multiple cores, don't create threads
  }
  DEBUG_POOL("initialize()\n");
  std::unique_lock<std::mutex> lock(threadMutex);
  // initial state before first resetThreadsAreReady()
  ready.store(threads.size());
  resetThreadsAreReady();
  for (size_t i = 0; i < num; i++) {
    try {
      threads.emplace_back(std::make_unique<Thread>(this));
    } catch (std::system_error&) {
      // failed to create a thread - don't use multithreading, as if num cores
      // == 1
      DEBUG_POOL("could not create thread\n");
      threads.clear();
      return;
    }
  }
  DEBUG_POOL("initialize() waiting\n");
  condition.wait(lock, [this]() { return areThreadsReady(); });
  DEBUG_POOL("initialize() is done\n");
}